

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O0

bool __thiscall bssl::SSLTranscript::Update(SSLTranscript *this,Span<const_unsigned_char> in)

{
  bool bVar1;
  size_t sVar2;
  Span<const_unsigned_char> SVar3;
  SSLTranscript *this_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = (uchar *)in.size_;
  this_local = (SSLTranscript *)in.data_;
  if (((this->field_0x28 & 1) == 0) || (this->version_ < 0x304)) {
    in_local.size_._7_1_ = AddToBufferOrHash(this,in);
  }
  else {
    sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local);
    if (sVar2 < 0xc) {
      in_local.size_._7_1_ = false;
    }
    else {
      SVar3 = Span<const_unsigned_char>::subspan((Span<const_unsigned_char> *)&this_local,0,4);
      bVar1 = AddToBufferOrHash(this,SVar3);
      if (bVar1) {
        SVar3 = Span<const_unsigned_char>::subspan
                          ((Span<const_unsigned_char> *)&this_local,0xc,0xffffffffffffffff);
        bVar1 = AddToBufferOrHash(this,SVar3);
        if (bVar1) {
          return true;
        }
      }
      in_local.size_._7_1_ = false;
    }
  }
  return in_local.size_._7_1_;
}

Assistant:

bool SSLTranscript::Update(Span<const uint8_t> in) {
  if (!is_dtls_ || version_ < TLS1_3_VERSION) {
    return AddToBufferOrHash(in);
  }
  if (in.size() < DTLS1_HM_HEADER_LENGTH) {
    return false;
  }
  // The message passed into Update is the whole Handshake or DTLSHandshake
  // message, including the msg_type and length. In DTLS, the DTLSHandshake
  // message also has message_seq, fragment_offset, and fragment_length
  // fields. In DTLS 1.3, those fields are omitted so that the same
  // transcript format as TLS 1.3 is used. This means we write the 1-byte
  // msg_type, 3-byte length, then skip 2+3+3 bytes for the DTLS-specific
  // fields that get omitted.
  if (!AddToBufferOrHash(in.subspan(0, 4)) ||
      !AddToBufferOrHash(in.subspan(12))) {
    return false;
  }
  return true;
}